

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_read_compressed_pixels
              (fitsfile *fptr,int datatype,LONGLONG fpixel,LONGLONG npixel,int nullcheck,
              void *nullval,void *array,char *nullarray,int *anynul,int *status)

{
  long lVar1;
  ulong uVar2;
  int bytesperpixel;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  undefined1 auVar8 [16];
  int planenul;
  int naxis;
  fitsfile *local_158;
  long nread;
  long local_148 [6];
  LONGLONG local_118;
  long lStack_110;
  ulong local_100;
  undefined1 local_f8 [16];
  long local_e8;
  long naxes [6];
  long inc [6];
  LONGLONG dimsize [6];
  
  if (0 < *status) {
    return *status;
  }
  local_118 = npixel;
  bytesperpixel = ffpxsz(datatype);
  lVar7 = 1;
  for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
    *(undefined8 *)(local_f8 + lVar3 * 8) = 0;
    local_148[lVar3] = 0;
    naxes[lVar3] = 1;
    inc[lVar3] = 1;
  }
  local_100 = (ulong)(uint)nullcheck;
  ffgidm(fptr,&naxis,status);
  local_158 = fptr;
  ffgisz(fptr,6,naxes,status);
  uVar2 = local_100;
  dimsize[0] = 1;
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    lVar7 = lVar7 * naxes[lVar3];
    dimsize[lVar3 + 1] = lVar7;
  }
  lVar7 = local_118 + fpixel + -2;
  lVar3 = fpixel + -1;
  uVar6 = (ulong)(uint)naxis;
  for (iVar5 = naxis; uVar6 = uVar6 - 1, 0 < iVar5; iVar5 = iVar5 + -1) {
    lVar1 = dimsize[uVar6];
    lVar4 = lVar3 / lVar1;
    lVar3 = lVar3 % lVar1;
    *(long *)(local_f8 + uVar6 * 8) = lVar4;
    lVar4 = lVar7 / lVar1;
    lVar7 = lVar7 % lVar1;
    local_148[uVar6] = lVar4;
  }
  iVar5 = (int)uVar2;
  if (naxis == 3) {
    if (((local_f8._8_8_ != 0 || local_f8._0_8_ != 0) || (local_148[0] != naxes[0] + -1)) ||
       (local_148[1] != naxes[1] + -1)) {
      if (anynul != (int *)0x0) {
        *anynul = 0;
      }
      local_118 = local_148[0];
      lStack_110 = local_148[1];
      if (local_e8 < local_148[2]) {
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        local_148[0] = naxes[0] + -1;
        local_148[1] = auVar8._8_8_ + naxes[1];
      }
      for (lVar7 = local_e8; lVar7 <= local_148[2]; lVar7 = lVar7 + 1) {
        if (lVar7 == local_148[2]) {
          local_148[0] = local_118;
          local_148[1] = lStack_110;
        }
        fits_read_compressed_img_plane
                  (local_158,datatype,bytesperpixel,lVar7,(LONGLONG *)local_f8,local_148,inc,naxes,
                   iVar5,nullval,array,nullarray,&planenul,&nread,status);
        if ((anynul != (int *)0x0) && (planenul != 0)) {
          *anynul = 1;
        }
        array = (void *)((long)array + nread * bytesperpixel);
        lVar3 = nread;
        if (nullarray == (char *)0x0) {
          lVar3 = 0;
        }
        local_f8 = (undefined1  [16])0x0;
        if (iVar5 != 2) {
          lVar3 = 0;
        }
        nullarray = nullarray + lVar3;
      }
      goto LAB_001c63f8;
    }
    for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
      *(long *)(local_f8 + lVar7 * 8) = *(long *)(local_f8 + lVar7 * 8) + 1;
      local_148[lVar7] = local_148[lVar7] + 1;
    }
  }
  else {
    if (naxis == 2) {
      fits_read_compressed_img_plane
                (local_158,datatype,bytesperpixel,0,(LONGLONG *)local_f8,local_148,inc,naxes,iVar5,
                 nullval,array,nullarray,anynul,&nread,status);
LAB_001c63f8:
      return *status;
    }
    if (naxis != 1) {
      ffpmsg("only 1D, 2D, or 3D images are currently supported");
      *status = 0x19e;
      return 0x19e;
    }
    local_f8._0_8_ = local_f8._0_8_ + 1;
    local_148[0] = local_148[0] + 1;
  }
  fits_read_compressed_img
            (local_158,datatype,(LONGLONG *)local_f8,local_148,inc,iVar5,nullval,array,nullarray,
             anynul,status);
  return *status;
}

Assistant:

int fits_read_compressed_pixels(fitsfile *fptr, /* I - FITS file pointer    */
            int  datatype,  /* I - datatype of the array to be returned     */
            LONGLONG   fpixel, /* I - 'first pixel to read          */
            LONGLONG   npixel,  /* I - number of pixels to read      */
            int  nullcheck,  /* I - 0 for no null checking                   */
                              /*     1: set undefined pixels = nullval       */
                              /*     2: set nullarray=1 for undefined pixels */
            void *nullval,    /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            char *nullarray,  /* O - array of flags = 1 if nullcheck = 2     */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
   Read a consecutive set of pixels from a compressed image.  This routine
   interpretes the n-dimensional image as a long one-dimensional array. 
   This is actually a rather inconvenient way to read compressed images in
   general, and could be rather inefficient if the requested pixels to be
   read are located in many different image compression tiles.    

   The general strategy used here is to read the requested pixels in blocks
   that correspond to rectangular image sections.  
*/
{
    int naxis, ii, bytesperpixel, planenul;
    long naxes[MAX_COMPRESS_DIM], nread;
    long nplane, inc[MAX_COMPRESS_DIM];
    LONGLONG tfirst, tlast, last0, last1, dimsize[MAX_COMPRESS_DIM];
    LONGLONG firstcoord[MAX_COMPRESS_DIM], lastcoord[MAX_COMPRESS_DIM];
    char *arrayptr, *nullarrayptr;

    if (*status > 0)
        return(*status);

    arrayptr = (char *) array;
    nullarrayptr = nullarray;

    /* get size of array pixels, in bytes */
    bytesperpixel = ffpxsz(datatype);

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        naxes[ii] = 1;
        firstcoord[ii] = 0;
        lastcoord[ii] = 0;
        inc[ii] = 1;
    }

    /*  determine the dimensions of the image to be read */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, MAX_COMPRESS_DIM, naxes, status);

    /* calc the cumulative number of pixels in each successive dimension */
    dimsize[0] = 1;
    for (ii = 1; ii < MAX_COMPRESS_DIM; ii++)
         dimsize[ii] = dimsize[ii - 1] * naxes[ii - 1];

    /*  determine the coordinate of the first and last pixel in the image */
    /*  Use zero based indexes here */
    tfirst = fpixel - 1;
    tlast = tfirst + npixel - 1;
    for (ii = naxis - 1; ii >= 0; ii--)
    {
        firstcoord[ii] = tfirst / dimsize[ii];
        lastcoord[ii] =  tlast / dimsize[ii];
        tfirst = tfirst - firstcoord[ii] * dimsize[ii];
        tlast = tlast - lastcoord[ii] * dimsize[ii];
    }

    /* to simplify things, treat 1-D, 2-D, and 3-D images as separate cases */

    if (naxis == 1)
    {
        /* Simple: just read the requested range of pixels */

        firstcoord[0] = firstcoord[0] + 1;
        lastcoord[0] = lastcoord[0] + 1;
        fits_read_compressed_img(fptr, datatype, firstcoord, lastcoord, inc,
            nullcheck, nullval, array, nullarray, anynul, status);
        return(*status);
    }
    else if (naxis == 2)
    {
        nplane = 0;  /* read 1st (and only) plane of the image */

        fits_read_compressed_img_plane(fptr, datatype, bytesperpixel,
          nplane, firstcoord, lastcoord, inc, naxes, nullcheck, nullval,
          array, nullarray, anynul, &nread, status);
    }
    else if (naxis == 3)
    {
        /* test for special case: reading an integral number of planes */
        if (firstcoord[0] == 0 && firstcoord[1] == 0 &&
            lastcoord[0] == naxes[0] - 1 && lastcoord[1] == naxes[1] - 1)
        {
            for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
            {
                /* convert from zero base to 1 base */
                (firstcoord[ii])++;
                (lastcoord[ii])++;
            }

            /* we can read the contiguous block of pixels in one go */
            fits_read_compressed_img(fptr, datatype, firstcoord, lastcoord, inc,
                nullcheck, nullval, array, nullarray, anynul, status);

            return(*status);
        }

        if (anynul)
            *anynul = 0;  /* initialize */

        /* save last coordinate in temporary variables */
        last0 = lastcoord[0];
        last1 = lastcoord[1];

        if (firstcoord[2] < lastcoord[2])
        {
            /* we will read up to the last pixel in all but the last plane */
            lastcoord[0] = naxes[0] - 1;
            lastcoord[1] = naxes[1] - 1;
        }

        /* read one plane of the cube at a time, for simplicity */
        for (nplane = (long) firstcoord[2]; nplane <= lastcoord[2]; nplane++)
        {
            if (nplane == lastcoord[2])
            {
                lastcoord[0] = last0;
                lastcoord[1] = last1;
            }

            fits_read_compressed_img_plane(fptr, datatype, bytesperpixel,
              nplane, firstcoord, lastcoord, inc, naxes, nullcheck, nullval,
              arrayptr, nullarrayptr, &planenul, &nread, status);

            if (planenul && anynul)
               *anynul = 1;  /* there are null pixels */

            /* for all subsequent planes, we start with the first pixel */
            firstcoord[0] = 0;
            firstcoord[1] = 0;

            /* increment pointers to next elements to be read */
            arrayptr = arrayptr + nread * bytesperpixel;
            if (nullarrayptr && (nullcheck == 2) )
                nullarrayptr = nullarrayptr + nread;
        }
    }
    else
    {
        ffpmsg("only 1D, 2D, or 3D images are currently supported");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    return(*status);
}